

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo::SerializeWithCachedSizes
          (SourceCodeInfo *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  SourceCodeInfo_Location *value;
  UnknownFieldSet *pUVar3;
  undefined4 local_1c;
  int i;
  CodedOutputStream *output_local;
  SourceCodeInfo *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = location_size(this);
    if (iVar2 <= local_1c) break;
    value = location(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(1,(MessageLite *)value,output);
    local_1c = local_1c + 1;
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void SourceCodeInfo::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (int i = 0; i < this->location_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->location(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}